

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clEnqueueSVMMigrateMem
                 (cl_command_queue command_queue,cl_uint num_svm_pointers,void **svm_pointers,
                 size_t *sizes,cl_mem_migration_flags flags,cl_uint num_events_in_wait_list,
                 cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  uint64_t uVar2;
  bool bVar3;
  byte bVar4;
  cl_int errorCode;
  cl_int errorCode_00;
  time_point tVar5;
  time_point tVar6;
  bool bVar7;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar8;
  allocator local_a9;
  uint64_t local_a8;
  cl_command_queue local_a0;
  string local_98;
  string eventWaitListString;
  time_point local_58;
  time_point local_50;
  cl_event local_event;
  
  this = g_pIntercept;
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  if ((g_pIntercept->m_Dispatch).clEnqueueSVMMigrateMem == (cl_api_clEnqueueSVMMigrateMem)0x0) {
    return -0x24;
  }
  local_a0 = command_queue;
  local_a8 = CLIntercept::incrementEnqueueCounter(g_pIntercept);
  if (((((this->m_Config).AubCapture == true) && ((this->m_Config).AubCaptureMinEnqueue <= local_a8)
       ) && (local_a8 <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    uVar8 = 0;
    CLIntercept::startAubCapture
              (this,"clEnqueueSVMMigrateMem",local_a8,(cl_kernel)0x0,0,(size_t *)0x0,(size_t *)0x0,
               local_a0);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_0012e5d5;
  getFormattedEventWaitList_abi_cxx11_
            (&eventWaitListString,this,num_events_in_wait_list,event_wait_list);
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_migration_flags_abi_cxx11_(&local_98,&this->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clEnqueueSVMMigrateMem",local_a8,(cl_kernel)0x0,
               "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",local_a0,
               CONCAT44(uVar8,num_svm_pointers),local_98._M_dataplus._M_p,flags,
               eventWaitListString._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueSVMMigrateMem",num_events_in_wait_list,event_wait_list,event);
  }
  local_event = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_50.__d.__r = (duration)0;
    bVar7 = false;
  }
  else {
    local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar7 = event == (cl_event *)0x0;
    if (bVar7) {
      event = &local_event;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clEnqueueSVMMigrateMem)
                        (local_a0,num_svm_pointers,svm_pointers,sizes,flags,num_events_in_wait_list,
                         event_wait_list,event);
  uVar2 = local_a8;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar5.__d.__r = (duration)0;
  }
  else {
    tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
        (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_98,"",&local_a9);
      CLIntercept::updateHostTimingStats(this,"clEnqueueSVMMigrateMem",&local_98,local_58,tVar5);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0012e3eb:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= uVar2) &&
         (uVar2 <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          std::__cxx11::string::string((string *)&local_98,"clEnqueueSVMMigrateMem",&local_a9);
          bVar3 = std::operator!=(&local_98,"clEnqueueUnmapMemObject");
          std::__cxx11::string::~string((string *)&local_98);
          if (!bVar3) goto LAB_0012e496;
        }
        std::__cxx11::string::string((string *)&local_98,"",&local_a9);
        CLIntercept::addTimingEvent
                  (this,"clEnqueueSVMMigrateMem",uVar2,local_50,&local_98,local_a0,*event);
        std::__cxx11::string::~string((string *)&local_98);
      }
LAB_0012e496:
      if (bVar7) {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_0012e4aa;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_0012e3eb;
LAB_0012e4aa:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar4 = (this->m_Config).ErrorAssert;
    if ((bool)bVar4 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0012e510;
    }
    else if (errorCode == 0) goto LAB_0012e4e4;
LAB_0012e4f7:
    if ((bVar4 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueSVMMigrateMem",errorCode);
      bVar4 = (this->m_Config).ErrorAssert;
      goto LAB_0012e4f7;
    }
LAB_0012e4e4:
    errorCode = 0;
  }
LAB_0012e510:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueSVMMigrateMem",errorCode,event,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_98,"",&local_a9);
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueSVMMigrateMem",&local_98,true,uVar2,local_58,tVar5);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,uVar2);
  }
  std::__cxx11::string::~string((string *)&eventWaitListString);
LAB_0012e5d5:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar5.__d.__r = (duration)0;
    }
    uVar2 = local_a8;
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueSVMMigrateMem");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(local_a0);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueSVMMigrateMem",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
          (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",&eventWaitListString,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&eventWaitListString,false,0,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar5.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
          (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",&eventWaitListString,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&eventWaitListString,false,0,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_a0);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueSVMMigrateMem(
    cl_command_queue command_queue,
    cl_uint num_svm_pointers,
    const void** svm_pointers,
    const size_t* sizes,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueSVMMigrateMem )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",
                command_queue,
                num_svm_pointers,
                pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                flags,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueSVMMigrateMem(
                command_queue,
                num_svm_pointers,
                svm_pointers,
                sizes,
                flags,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END();
            DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}